

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_segment_suite.cpp
# Opt level: O0

void data_suite::segment_empty(void)

{
  pointer *this;
  pointer *this_00;
  initializer_list<int> __l;
  pointer ptVar1;
  pointer ptVar2;
  size_type sVar3;
  iterator iVar4;
  iterator iVar5;
  undefined1 auStack_158 [8];
  vector<int,_std::allocator<int>_> expect_3;
  undefined1 local_138 [8];
  segment segment_3;
  allocator<int> local_111;
  int local_110 [4];
  iterator local_100;
  size_type local_f8;
  undefined1 local_f0 [8];
  vector<int,_std::allocator<int>_> expect_2;
  segment segment_2;
  undefined1 auStack_b8 [8];
  vector<int,_std::allocator<int>_> expect_1;
  undefined1 local_98 [8];
  segment segment_1;
  undefined1 auStack_68 [8];
  vector<int,_std::allocator<int>_> expect;
  undefined1 local_48 [8];
  segment segment;
  circular_view<int,_18446744073709551615UL> span;
  int array [4];
  
  span.member.next = 0;
  this = &segment.member.tail;
  vista::circular_view<int,_18446744073709551615UL>::circular_view<4UL,_0>
            ((circular_view<int,_18446744073709551615UL> *)this,
             (value_type (*) [4])&span.member.next);
  _local_48 = (member_storage<int,_18446744073709551615UL>)
              vista::circular_view<int,_18446744073709551615UL>::first_segment
                        ((circular_view<int,_18446744073709551615UL> *)this);
  auStack_68 = (undefined1  [8])0x0;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)auStack_68);
  ptVar1 = vista::span<int,_18446744073709551615UL>::data
                     ((span<int,_18446744073709551615UL> *)local_48);
  ptVar2 = vista::span<int,_18446744073709551615UL>::data
                     ((span<int,_18446744073709551615UL> *)local_48);
  sVar3 = vista::span<int,_18446744073709551615UL>::size
                    ((span<int,_18446744073709551615UL> *)local_48);
  iVar4 = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)auStack_68);
  iVar5 = std::vector<int,_std::allocator<int>_>::end
                    ((vector<int,_std::allocator<int>_> *)auStack_68);
  boost::detail::
  test_all_eq_impl<std::ostream,int*,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_segment_suite.cpp"
             ,0xbf,"void data_suite::segment_empty()",ptVar1,ptVar2 + sVar3,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar4._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar5._M_current);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)auStack_68);
  _local_98 = (member_storage<int,_18446744073709551615UL>)
              vista::circular_view<int,_18446744073709551615UL>::last_segment
                        ((circular_view<int,_18446744073709551615UL> *)&segment.member.tail);
  auStack_b8 = (undefined1  [8])0x0;
  expect_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  expect_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)auStack_b8);
  ptVar1 = vista::span<int,_18446744073709551615UL>::data
                     ((span<int,_18446744073709551615UL> *)local_98);
  ptVar2 = vista::span<int,_18446744073709551615UL>::data
                     ((span<int,_18446744073709551615UL> *)local_98);
  sVar3 = vista::span<int,_18446744073709551615UL>::size
                    ((span<int,_18446744073709551615UL> *)local_98);
  iVar4 = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)auStack_b8);
  iVar5 = std::vector<int,_std::allocator<int>_>::end
                    ((vector<int,_std::allocator<int>_> *)auStack_b8);
  boost::detail::
  test_all_eq_impl<std::ostream,int*,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_segment_suite.cpp"
             ,0xc6,"void data_suite::segment_empty()",ptVar1,ptVar2 + sVar3,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar4._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar5._M_current);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)auStack_b8);
  join_0x00000010_0x00000000_ =
       (member_storage<int,_18446744073709551615UL>)
       vista::circular_view<int,_18446744073709551615UL>::first_unused_segment
                 ((circular_view<int,_18446744073709551615UL> *)&segment.member.tail);
  local_110[0] = 0;
  local_110[1] = 0;
  local_110[2] = 0;
  local_110[3] = 0;
  local_100 = local_110;
  local_f8 = 4;
  std::allocator<int>::allocator(&local_111);
  __l._M_len = local_f8;
  __l._M_array = local_100;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_f0,__l,&local_111);
  std::allocator<int>::~allocator(&local_111);
  this_00 = &expect_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  ptVar1 = vista::span<int,_18446744073709551615UL>::data
                     ((span<int,_18446744073709551615UL> *)this_00);
  ptVar2 = vista::span<int,_18446744073709551615UL>::data
                     ((span<int,_18446744073709551615UL> *)this_00);
  sVar3 = vista::span<int,_18446744073709551615UL>::size
                    ((span<int,_18446744073709551615UL> *)this_00);
  iVar4 = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)local_f0);
  segment_3.member.tail =
       (pointer)std::vector<int,_std::allocator<int>_>::end
                          ((vector<int,_std::allocator<int>_> *)local_f0);
  boost::detail::
  test_all_eq_impl<std::ostream,int*,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_segment_suite.cpp"
             ,0xcd,"void data_suite::segment_empty()",ptVar1,ptVar2 + sVar3,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar4._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             segment_3.member.tail);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_f0);
  _local_138 = (member_storage<int,_18446744073709551615UL>)
               vista::circular_view<int,_18446744073709551615UL>::last_unused_segment
                         ((circular_view<int,_18446744073709551615UL> *)&segment.member.tail);
  auStack_158 = (undefined1  [8])0x0;
  expect_3.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  expect_3.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)auStack_158);
  ptVar1 = vista::span<int,_18446744073709551615UL>::data
                     ((span<int,_18446744073709551615UL> *)local_138);
  ptVar2 = vista::span<int,_18446744073709551615UL>::data
                     ((span<int,_18446744073709551615UL> *)local_138);
  sVar3 = vista::span<int,_18446744073709551615UL>::size
                    ((span<int,_18446744073709551615UL> *)local_138);
  iVar4 = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)auStack_158);
  iVar5 = std::vector<int,_std::allocator<int>_>::end
                    ((vector<int,_std::allocator<int>_> *)auStack_158);
  boost::detail::
  test_all_eq_impl<std::ostream,int*,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_segment_suite.cpp"
             ,0xd4,"void data_suite::segment_empty()",ptVar1,ptVar2 + sVar3,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar4._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar5._M_current);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)auStack_158);
  return;
}

Assistant:

void segment_empty()
{
    int array[4] = {};
    circular_view<int> span(array);
    {
        auto segment = span.first_segment();

        std::vector<int> expect = { };
        BOOST_TEST_ALL_EQ(segment.data(), segment.data() + segment.size(),
                          expect.begin(), expect.end());
    }
    {
        auto segment = span.last_segment();

        std::vector<int> expect = { };
        BOOST_TEST_ALL_EQ(segment.data(), segment.data() + segment.size(),
                          expect.begin(), expect.end());
    }
    {
        auto segment = span.first_unused_segment();

        std::vector<int> expect = { 0, 0, 0, 0 };
        BOOST_TEST_ALL_EQ(segment.data(), segment.data() + segment.size(),
                          expect.begin(), expect.end());
    }
    {
        auto segment = span.last_unused_segment();

        std::vector<int> expect = { };
        BOOST_TEST_ALL_EQ(segment.data(), segment.data() + segment.size(),
                          expect.begin(), expect.end());
    }
}